

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall
ON_ClippingRegionPoints::AppendClipPoint
          (ON_ClippingRegionPoints *this,ON_3dPoint clip_point,uint clip_flag)

{
  bool bVar1;
  ON_3dPoint *pOVar2;
  ulong local_40;
  ulong local_28;
  size_t buffer_point_capacity;
  uint clip_flag_local;
  ON_ClippingRegionPoints *this_local;
  
  if (this->m_point_capacity <= this->m_point_count) {
    if (this->m_buffer_point_capacity == 0) {
      local_40 = 0x20;
    }
    else {
      local_40 = this->m_buffer_point_capacity << 1;
    }
    local_28 = local_40;
    if (local_40 < this->m_point_count) {
      local_28 = (ulong)(this->m_point_count + 0x20);
    }
    bVar1 = ReserveBufferPointCapacity(this,local_28);
    if (!bVar1) {
      return false;
    }
  }
  pOVar2 = this->m_clip_points + this->m_point_count;
  pOVar2->x = clip_point.x;
  pOVar2->y = clip_point.y;
  pOVar2->z = clip_point.z;
  this->m_clip_flags[this->m_point_count] = clip_flag;
  if (this->m_point_count == 0) {
    this->m_and_clip_flags = clip_flag;
    this->m_or_clip_flags = clip_flag;
  }
  else {
    this->m_and_clip_flags = clip_flag & this->m_and_clip_flags;
    this->m_or_clip_flags = clip_flag | this->m_or_clip_flags;
  }
  this->m_point_count = this->m_point_count + 1;
  return true;
}

Assistant:

bool ON_ClippingRegionPoints::AppendClipPoint(
  ON_3dPoint clip_point,
  unsigned int clip_flag
  )
{
  if (m_point_count >= m_point_capacity)
  {
    size_t buffer_point_capacity = (0 == m_buffer_point_capacity) ? 32 : 2*m_buffer_point_capacity;
    if ( buffer_point_capacity < m_point_count )
      buffer_point_capacity = m_point_count+32;

    if (false == ReserveBufferPointCapacity(buffer_point_capacity))
      return false;
  }

  m_clip_points[m_point_count] = clip_point;
  m_clip_flags[m_point_count] = clip_flag;
  if (0 == m_point_count)
  {
    m_and_clip_flags = clip_flag;
    m_or_clip_flags = clip_flag;
  }
  else
  {
    m_and_clip_flags &= clip_flag;
    m_or_clip_flags |= clip_flag;
  }

  m_point_count++;

  return true;
}